

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O1

idx_t duckdb::GetPartitioningSpaceRequirement
                (ClientContext *context,vector<duckdb::LogicalType,_true> *types,idx_t radix_bits,
                idx_t num_threads)

{
  int iVar1;
  BufferManager *pBVar2;
  idx_t iVar3;
  undefined4 extraout_var;
  ulong uVar4;
  undefined4 extraout_var_00;
  bool all_constant;
  bool local_29;
  
  pBVar2 = BufferManager::GetBufferManager(context);
  iVar3 = GetTupleWidth(types,&local_29);
  iVar1 = (*pBVar2->_vptr_BufferManager[0xf])(pBVar2);
  uVar4 = CONCAT44(extraout_var,iVar1) / iVar3;
  iVar1 = (*pBVar2->_vptr_BufferManager[0xe])(pBVar2);
  return CONCAT44(extraout_var_00,iVar1) * (num_threads << ((byte)radix_bits & 0x3f)) *
         ((uVar4 + 0x800) / uVar4 + (ulong)(local_29 ^ 1) * 2 + 1);
}

Assistant:

static idx_t GetPartitioningSpaceRequirement(ClientContext &context, const vector<LogicalType> &types,
                                             const idx_t radix_bits, const idx_t num_threads) {
	auto &buffer_manager = BufferManager::GetBufferManager(context);
	bool all_constant;
	idx_t tuple_width = GetTupleWidth(types, all_constant);

	auto tuples_per_block = buffer_manager.GetBlockSize() / tuple_width;
	auto blocks_per_chunk = (STANDARD_VECTOR_SIZE + tuples_per_block) / tuples_per_block + 1;
	if (!all_constant) {
		blocks_per_chunk += 2;
	}
	auto size_per_partition = blocks_per_chunk * buffer_manager.GetBlockAllocSize();
	auto num_partitions = RadixPartitioning::NumberOfPartitions(radix_bits);

	return num_threads * num_partitions * size_per_partition;
}